

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeSMLAInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint64_t Address_00;
  uint64_t Address_01;
  uint64_t Address_02;
  uint64_t Address_03;
  
  if (Insn >> 0x1c == 0xf) {
    DVar1 = DecodeCPSInstruction(Inst,Insn,Address,Decoder);
    return DVar1;
  }
  DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0x10 & 0xf,Address,Decoder);
  if (((((DVar1 | 2) == MCDisassembler_Success) &&
       ((DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn & 0xf,Address_00,Decoder),
        DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
      ((DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 8 & 0xf,Address_01,Decoder),
       DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) &&
     ((DVar1 = DecodeGPRnopcRegisterClass(Inst,Insn >> 0xc & 0xf,Address_02,Decoder),
      DVar1 == MCDisassembler_Success || (DVar1 == MCDisassembler_SoftFail)))) {
    DVar1 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_03,Decoder);
    DVar1 = (*(code *)(&DAT_001c9f1c + *(int *)(&DAT_001c9f1c + (ulong)DVar1 * 4)))();
    return DVar1;
  }
  return MCDisassembler_Fail;
}

Assistant:

static DecodeStatus DecodeSMLAInstruction(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned Rd = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rn = fieldFromInstruction_4(Insn, 0, 4);
	unsigned Rm = fieldFromInstruction_4(Insn, 8, 4);
	unsigned Ra = fieldFromInstruction_4(Insn, 12, 4);
	unsigned pred = fieldFromInstruction_4(Insn, 28, 4);

	if (pred == 0xF)
		return DecodeCPSInstruction(Inst, Insn, Address, Decoder);

	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rd, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Rm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRnopcRegisterClass(Inst, Ra, Address, Decoder)))
		return MCDisassembler_Fail;

	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}